

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O1

SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::operator=(SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *this,CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *_rhs)

{
  double dVar1;
  double dVar2;
  Nested pMVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double dVar8;
  Index size;
  Index index;
  ulong uVar9;
  long lVar10;
  
  pMVar3 = _rhs->m_xpr;
  uVar4 = (this->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
          .m_rows;
  if (uVar4 == (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows) {
    dVar1 = (_rhs->m_functor).m_other;
    uVar9 = uVar4 - ((long)uVar4 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar4) {
      lVar10 = 0;
      do {
        pdVar5 = (this->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        pdVar6 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + lVar10;
        dVar8 = pdVar6[1];
        pdVar7 = pdVar5 + lVar10;
        dVar2 = pdVar7[1];
        pdVar5 = pdVar5 + lVar10;
        *pdVar5 = *pdVar6 * dVar1 + *pdVar7;
        pdVar5[1] = dVar8 * dVar1 + dVar2;
        lVar10 = lVar10 + 2;
      } while (lVar10 < (long)uVar9);
    }
    if ((long)uVar9 < (long)uVar4) {
      pdVar6 = (this->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_data;
      pdVar7 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      do {
        pdVar6[uVar9] = pdVar7[uVar9] * dVar1 + pdVar6[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
    }
    return this;
  }
  __assert_fail("rows() == rhs.rows() && cols() == rhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/SelfCwiseBinaryOp.h"
                ,0x88,
                "SelfCwiseBinaryOp<BinOp, Lhs, Rhs> &Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, Eigen::Matrix<double, -1, 1>, Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>>::lazyAssign(const DenseBase<RhsDerived> &) [BinOp = Eigen::internal::scalar_sum_op<double>, Lhs = Eigen::Matrix<double, -1, 1>, Rhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, RhsDerived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>]"
               );
}

Assistant:

SelfCwiseBinaryOp& operator=(const Rhs& _rhs)
    {
      typename internal::nested<Rhs>::type rhs(_rhs);
      return Base::operator=(rhs);
    }